

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O2

int64_t __thiscall absl::ToUnixMillis(absl *this,Time t)

{
  int64_t iVar1;
  Duration d;
  
  d._8_8_ = t.rep_.rep_hi_;
  if ((ulong)this >> 0x35 == 0) {
    return (d._8_8_ & 0xffffffff) / 4000000 + (long)this * 1000;
  }
  d.rep_hi_ = (int64_t)this;
  iVar1 = anon_unknown_8::FloorToUnit(d,(Duration)(ZEXT816(4000000) << 0x40));
  return iVar1;
}

Assistant:

int64_t ToUnixMillis(Time t) {
  if (time_internal::GetRepHi(time_internal::ToUnixDuration(t)) >= 0 &&
      time_internal::GetRepHi(time_internal::ToUnixDuration(t)) >> 53 == 0) {
    return (time_internal::GetRepHi(time_internal::ToUnixDuration(t)) * 1000) +
           (time_internal::GetRepLo(time_internal::ToUnixDuration(t)) /
            (4000 * 1000));
  }
  return FloorToUnit(time_internal::ToUnixDuration(t), absl::Milliseconds(1));
}